

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNewLineStyle.cxx
# Opt level: O2

string * __thiscall
cmNewLineStyle::GetCharacters_abi_cxx11_(string *__return_storage_ptr__,cmNewLineStyle *this)

{
  Style SVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  SVar1 = this->NewLineStyle;
  if (SVar1 == CRLF) {
    pcVar3 = "\r\n";
    paVar2 = &local_b;
  }
  else if (SVar1 == LF) {
    pcVar3 = "\n";
    paVar2 = &local_a;
  }
  else {
    pcVar3 = "";
    if (SVar1 == Invalid) {
      paVar2 = &local_9;
    }
    else {
      paVar2 = &local_c;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

const std::string cmNewLineStyle::GetCharacters() const
{
  switch (NewLineStyle)
    {
    case Invalid:
      return "";
    case LF:
      return "\n";
    case CRLF:
      return "\r\n";
    }
  return "";
}